

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

Comment * soul::SourceCodeUtilities::parseComment(Comment *__return_storage_ptr__,CodeLocation *pos)

{
  UTF8Reader *this;
  SourceCodeText *pSVar1;
  byte bVar2;
  pointer pcVar3;
  undefined8 uVar4;
  UTF8Reader UVar5;
  bool bVar6;
  UnicodeChar UVar7;
  SourceCodeText *oldObject;
  text *ptVar8;
  text **pptVar9;
  SourceCodeText *pSVar10;
  SourceCodeText *pSVar11;
  pointer pcVar12;
  uint uVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  undefined1 in_R9B;
  undefined8 __first;
  SourceCodeText *pSVar14;
  long lVar15;
  Comment *pCVar16;
  iterator __begin4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t leastLeadingSpace;
  long lVar17;
  pointer pcVar18;
  string_view source;
  UTF8Reader t;
  UTF8Reader closeComment;
  undefined1 local_150 [16];
  undefined1 local_140 [24];
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_108;
  UTF8Reader UStack_f8;
  UTF8Reader local_f0;
  SourceCodeText *local_e8;
  text *local_e0;
  undefined1 local_d8 [16];
  SourceCodeText *local_c8;
  undefined1 local_c0 [16];
  _Alloc_hider _Stack_b0;
  SourceCodeText *local_a8;
  undefined1 local_a0 [8];
  undefined1 local_98 [32];
  SourceCodeText *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  size_type local_58 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pSVar10 = (pos->sourceCode).object;
  if ((pSVar10 == (SourceCodeText *)0x0) || ((pSVar10->content)._M_string_length == 0)) {
    __return_storage_ptr__->valid = false;
    __return_storage_ptr__->isStarSlash = false;
    __return_storage_ptr__->isDoxygenStyle = false;
    __return_storage_ptr__->isReferringBackwards = false;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->range).start.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).start.location.data = (char *)0x0;
    (__return_storage_ptr__->range).end.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).end.location.data = (char *)0x0;
    return __return_storage_ptr__;
  }
  local_128._0_4_ = 0;
  local_128._8_8_ = (SourceCodeText *)0x0;
  aStack_118._M_allocated_capacity = 0;
  aStack_118._8_8_ = (pointer)0x0;
  aStack_108._M_allocated_capacity = 0;
  aStack_108._8_8_ = 0;
  UStack_f8.data = (char *)0x0;
  local_f0.data = (char *)0x0;
  this = &pos->location;
  local_150._0_8_ = (pos->location).data;
  while ((uVar4 = aStack_108._M_allocated_capacity, *(byte *)local_150._0_8_ - 9 < 5 ||
         (*(byte *)local_150._0_8_ == 0x20))) {
    UTF8Reader::operator++((UTF8Reader *)local_150);
  }
  (pos->location).data = (char *)local_150._0_8_;
  aStack_108._M_allocated_capacity = (size_type)(pos->sourceCode).object;
  if ((SourceCodeText *)aStack_108._M_allocated_capacity != (SourceCodeText *)0x0) {
    (((SourceCodeText *)aStack_108._M_allocated_capacity)->super_RefCountedObject).refCount =
         (((SourceCodeText *)aStack_108._M_allocated_capacity)->super_RefCountedObject).refCount + 1
    ;
  }
  local_140._16_8_ = __return_storage_ptr__;
  local_a8 = (SourceCodeText *)pos;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)uVar4);
  pSVar10 = (SourceCodeText *)this->data;
  lVar17 = 0;
  local_150._0_8_ = pSVar10;
  aStack_108._8_8_ = pSVar10;
LAB_001cc270:
  pCVar16 = (Comment *)local_140._16_8_;
  if (lVar17 != 2) goto code_r0x001cc276;
  this->data = (char *)local_150._0_8_;
  local_128._0_2_ = 0x101;
  while (UVar7 = UTF8Reader::operator*(this), UVar7 == 0x2a) {
    local_128[2] = 1;
    UTF8Reader::operator++(this);
  }
  goto LAB_001cc341;
code_r0x001cc276:
  bVar2 = "/*"[lVar17];
  lVar17 = lVar17 + 1;
  UVar7 = UTF8Reader::getAndAdvance((UTF8Reader *)local_150);
  pCVar16 = (Comment *)local_140._16_8_;
  if (UVar7 != bVar2) goto code_r0x001cc28a;
  goto LAB_001cc270;
code_r0x001cc28a:
  lVar17 = 0;
  local_150._0_8_ = pSVar10;
  while (lVar17 != 2) {
    bVar2 = "//"[lVar17];
    lVar17 = lVar17 + 1;
    UVar7 = UTF8Reader::getAndAdvance((UTF8Reader *)local_150);
    if (UVar7 != bVar2) goto LAB_001cc783;
  }
  this->data = (char *)local_150._0_8_;
  local_128._0_2_ = 1;
  while (UVar7 = UTF8Reader::operator*(this), UVar7 == 0x2f) {
    local_128[2] = 1;
    UTF8Reader::operator++(this);
  }
LAB_001cc341:
  local_150._0_8_ = this->data;
  lVar17 = 0;
  do {
    if (lVar17 == 1) {
      this->data = (char *)local_150._0_8_;
      local_128[3] = 1;
      pSVar10 = local_a8;
      break;
    }
    bVar2 = "<<"[lVar17 + 1];
    lVar17 = lVar17 + 1;
    UVar7 = UTF8Reader::getAndAdvance((UTF8Reader *)local_150);
    pSVar10 = local_a8;
  } while (UVar7 == bVar2);
  while (UVar7 = UTF8Reader::operator*(this), UVar7 == 0x20) {
    UTF8Reader::operator++(this);
  }
  if (local_128[1] == '\0') {
    pSVar1 = (SourceCodeText *)(local_70._M_local_buf + 8);
    do {
      CodeLocation::getSourceLine_abi_cxx11_((string *)pSVar1,(CodeLocation *)pSVar10);
      __it._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar1;
      choc::text::trim((string *)local_150,(string *)pSVar1);
      if ((size_type *)local_70._8_8_ != local_58) {
        __it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_58[0] + 1);
        operator_delete((void *)local_70._8_8_,(ulong)__it._M_current);
      }
      if (((ulong)local_150._8_8_ < (text *)0x2) || (*(short *)local_150._0_8_ != 0x2f2f)) {
        bVar6 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_98,(ulong)local_150);
        while( true ) {
          std::__cxx11::string::operator=((string *)local_150,(string *)local_98);
          if ((SourceCodeText *)local_98._0_8_ != (SourceCodeText *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_98._16_8_)->_M_p + 1));
          }
          if (((text *)local_150._8_8_ == (text *)0x0) ||
             (*(string *)local_150._0_8_ != (string)0x2f)) break;
          std::__cxx11::string::substr((ulong)local_98,(ulong)local_150);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_128 + 8),(string *)local_150);
        __it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar10;
        CodeLocation::getStartOfNextLine((CodeLocation *)local_98);
        pSVar14 = *(SourceCodeText **)pSVar10;
        pSVar11 = (SourceCodeText *)local_98._0_8_;
        if ((SourceCodeText *)local_98._0_8_ != pSVar14) {
          *(undefined8 *)pSVar10 = local_98._0_8_;
          local_98._0_8_ = (SourceCodeText *)0x0;
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar14);
          pSVar11 = (SourceCodeText *)0x0;
        }
        this->data = (char *)local_98._8_8_;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar11);
        bVar6 = true;
      }
      if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
        __it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_140._0_8_ + 1);
        operator_delete((void *)local_150._0_8_,(ulong)__it._M_current);
      }
      UVar5.data = UStack_f8.data;
      pSVar10 = local_a8;
    } while (bVar6);
    UStack_f8.data = *(char **)local_a8;
    if ((SourceCodeText *)UStack_f8.data != (SourceCodeText *)0x0) {
      (((SourceCodeText *)UStack_f8.data)->super_RefCountedObject).refCount =
           (((SourceCodeText *)UStack_f8.data)->super_RefCountedObject).refCount + 1;
    }
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)UVar5.data);
    uVar4 = aStack_118._M_allocated_capacity;
    local_f0.data = this->data;
    if (local_128._8_8_ != aStack_118._M_allocated_capacity) {
      pcVar18 = (pointer)0x3e8;
      pSVar10 = (SourceCodeText *)local_128._8_8_;
      do {
        pcVar3 = (pSVar10->filename)._M_dataplus._M_p;
        if (pcVar3 != (pointer)0x0) {
          __it._M_current =
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pSVar10;
          pcVar12 = (pointer)0x0;
          do {
            if (pcVar12[(long)&((_Alloc_hider *)
                               &((SourceCodeText *)__it._M_current)->super_RefCountedObject)->_M_p]
                != ' ') goto LAB_001cc96c;
            pcVar12 = pcVar12 + 1;
          } while (pcVar3 != pcVar12);
        }
        pcVar12 = (pointer)0x0;
LAB_001cc96c:
        if (pcVar12 < pcVar18) {
          pcVar18 = pcVar12;
        }
        pSVar10 = (SourceCodeText *)((pSVar10->filename).field_2._M_local_buf + 8);
      } while (pSVar10 != (SourceCodeText *)aStack_118._M_allocated_capacity);
      if (pcVar18 != (pointer)0x0) {
        pSVar10 = (SourceCodeText *)local_128._8_8_;
        do {
          std::__cxx11::string::substr((ulong)local_150,(ulong)pSVar10);
          __it._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150;
          std::__cxx11::string::operator=((string *)pSVar10,(string *)local_150);
          if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
            __it._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_140._0_8_ + 1);
            operator_delete((void *)local_150._0_8_,(ulong)__it._M_current);
          }
          pSVar10 = (SourceCodeText *)((pSVar10->filename).field_2._M_local_buf + 8);
        } while (pSVar10 != (SourceCodeText *)uVar4);
      }
    }
  }
  else {
    UTF8Reader::find((UTF8Reader *)local_a0,(char *)this);
    if (*(char *)local_a0 == '\0') {
LAB_001cc783:
      pCVar16->valid = false;
      pCVar16->isStarSlash = false;
      pCVar16->isDoxygenStyle = false;
      pCVar16->isReferringBackwards = false;
      (pCVar16->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pCVar16->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pCVar16->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pCVar16->range).start.sourceCode.object = (SourceCodeText *)0x0;
      (pCVar16->range).start.location.data = (char *)0x0;
      (pCVar16->range).end.sourceCode.object = (SourceCodeText *)0x0;
      (pCVar16->range).end.location.data = (char *)0x0;
      goto LAB_001ccbb0;
    }
    local_150._0_8_ = (SourceCodeText *)local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,this->data);
    local_98[0] = 10;
    source._M_str = local_98;
    source._M_len = local_150._0_8_;
    choc::text::
    splitString<choc::text::splitString[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,char,bool)::_lambda(char)_1_>
              (&local_48,(text *)local_150._8_8_,source,(anon_class_1_1_b77187a0 *)0x0,(bool)in_R9B)
    ;
    local_98._16_8_ = aStack_118._8_8_;
    local_98._8_8_ = aStack_118._M_allocated_capacity;
    local_98._0_8_ = local_128._8_8_;
    aStack_118._8_8_ =
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_128._8_8_ =
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    aStack_118._M_allocated_capacity =
         (size_type)
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
      operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
    }
    pcVar18 = (pSVar10->filename)._M_dataplus._M_p;
    __it._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar10;
    CodeLocation::getStartOfLine((CodeLocation *)local_150);
    local_70._M_allocated_capacity = (size_type)(pcVar18 + -local_150._8_8_);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_150._0_8_);
    local_78 = (SourceCodeText *)aStack_118._M_allocated_capacity;
    if (local_128._8_8_ != aStack_118._M_allocated_capacity) {
      pSVar1 = (SourceCodeText *)(local_c0 + 8);
      pSVar14 = (SourceCodeText *)local_128._8_8_;
      do {
        local_e8 = (SourceCodeText *)local_d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,*(long *)pSVar14,
                   (pSVar14->filename)._M_dataplus._M_p + *(long *)pSVar14);
        for (ptVar8 = local_e0; ptVar8 != (text *)0x0; ptVar8 = ptVar8 + -1) {
          if ((4 < (byte)(&local_e8[-1].field_0x57)[(long)ptVar8] - 9) &&
             ((&local_e8[-1].field_0x57)[(long)ptVar8] != 0x20)) {
            ptVar8[(long)&local_e8->super_RefCountedObject] = (text)0x0;
            if (local_e8 == (SourceCodeText *)local_d8) {
              local_140._8_8_ = local_d8._8_8_;
              local_150._0_8_ = (SourceCodeText *)local_140;
            }
            else {
              local_150._0_8_ = local_e8;
            }
            local_140._0_8_ = local_d8._0_8_;
            pptVar9 = &local_e0;
            pSVar11 = (SourceCodeText *)local_d8;
            local_150._8_8_ = ptVar8;
            local_e8 = (SourceCodeText *)local_d8;
            local_e0 = ptVar8;
            goto LAB_001cc54f;
          }
        }
        pptVar9 = (text **)(local_150 + 8);
        pSVar11 = (SourceCodeText *)local_140;
        local_150._0_8_ = (SourceCodeText *)local_140;
LAB_001cc54f:
        *pptVar9 = (text *)0x0;
        *(undefined1 *)&(pSVar11->super_RefCountedObject).refCount = 0;
        std::__cxx11::string::operator=((string *)pSVar14,(string *)local_150);
        if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
          operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
        }
        if (local_e8 != (SourceCodeText *)local_d8) {
          operator_delete(local_e8,local_d8._0_8_ + 1);
        }
        pcVar18 = (pSVar14->filename)._M_dataplus._M_p;
        __it._M_current =
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pSVar14;
        local_c8 = pSVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,__it._M_current,
                   pcVar18 + (long)&((_Alloc_hider *)
                                    &((SourceCodeText *)__it._M_current)->super_RefCountedObject)->
                                    _M_p);
        pSVar11 = (SourceCodeText *)__it._M_current;
        if ((text *)local_c0._0_8_ == (text *)0x0) {
LAB_001cc5e7:
          local_150._0_8_ = local_140;
          local_150._8_8_ = (text *)0x0;
          local_140._0_8_ = local_140._0_8_ & 0xffffffffffffff00;
          ptVar8 = (text *)0x0;
          __it._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar11;
        }
        else {
          bVar2 = *(byte *)&((_Alloc_hider *)&local_c8->super_RefCountedObject)->_M_p;
          if ((bVar2 - 9 < 5) || (bVar2 == 0x20)) {
            if ((text *)local_c0._0_8_ != (text *)0x1) {
              ptVar8 = (text *)(local_c0._0_8_ - 1);
              __it._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
              do {
                __it._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((_Alloc_hider *)
                             &((SourceCodeText *)__it._M_current)->super_RefCountedObject)->_M_p + 1
                     );
                bVar2 = *(byte *)&((_Alloc_hider *)
                                  &((SourceCodeText *)__it._M_current)->super_RefCountedObject)->
                                  _M_p;
                uVar13 = bVar2 - 9;
                pSVar11 = (SourceCodeText *)(ulong)uVar13;
                if ((4 < uVar13) && (bVar2 != 0x20)) {
                  local_150._0_8_ = local_140;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                            ((string *)local_150,__it._M_current,
                             (text *)((long)&((_Alloc_hider *)&local_c8->super_RefCountedObject)->
                                             _M_p + local_c0._0_8_));
                  goto LAB_001cc760;
                }
                ptVar8 = ptVar8 + -1;
              } while (ptVar8 != (text *)0x0);
            }
            goto LAB_001cc5e7;
          }
          if (local_c8 == pSVar1) {
            local_140._8_8_ = _Stack_b0._M_p;
            local_c8 = (SourceCodeText *)local_140;
          }
          local_140._1_7_ = local_c0._9_7_;
          local_140[0] = local_c0[8];
          local_150._8_8_ = local_c0._0_8_;
          local_c0._0_8_ = (text *)0x0;
          local_c0[8] = '\0';
          local_150._0_8_ = local_c8;
          local_c8 = pSVar1;
LAB_001cc760:
          ptVar8 = (text *)local_150._8_8_;
          if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
            __it._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_140._0_8_ + 1);
            operator_delete((void *)local_150._0_8_,(ulong)__it._M_current);
          }
        }
        if (local_c8 != pSVar1) {
          __it._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (CONCAT71(local_c0._9_7_,local_c0[8]) + 1);
          operator_delete(local_c8,(ulong)__it._M_current);
        }
        if ((0 < (long)local_70._M_allocated_capacity) &&
           (local_70._M_allocated_capacity <= pcVar18 + -(long)ptVar8)) {
          __it._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150;
          std::__cxx11::string::substr((ulong)__it._M_current,(ulong)pSVar14);
          std::__cxx11::string::operator=((string *)pSVar14,(string *)__it._M_current);
          if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
            __it._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_140._0_8_ + 1);
            operator_delete((void *)local_150._0_8_,(ulong)__it._M_current);
          }
        }
        pSVar14 = (SourceCodeText *)((pSVar14->filename).field_2._M_local_buf + 8);
      } while (pSVar14 != local_78);
    }
    UVar5.data = UStack_f8.data;
    UStack_f8.data = *(char **)pSVar10;
    if ((SourceCodeText *)UStack_f8.data != (SourceCodeText *)0x0) {
      (((SourceCodeText *)UStack_f8.data)->super_RefCountedObject).refCount =
           (((SourceCodeText *)UStack_f8.data)->super_RefCountedObject).refCount + 1;
    }
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)UVar5.data);
    local_f0.data = (char *)local_a0;
    UTF8Reader::operator++(&local_f0);
    UTF8Reader::operator++(&local_f0);
  }
  uVar4 = aStack_118._M_allocated_capacity;
  lVar17 = aStack_118._M_allocated_capacity - local_128._8_8_;
  pSVar10 = (SourceCodeText *)local_128._8_8_;
  if (lVar17 >> 7 < 1) {
LAB_001cca7a:
    pCVar16 = (Comment *)local_140._16_8_;
    lVar17 = lVar17 >> 5;
    if (lVar17 == 1) {
LAB_001ccaca:
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)pSVar10,__it);
      __first = pSVar10;
      if (!bVar6) {
        __first = uVar4;
      }
      goto LAB_001ccadb;
    }
    if (lVar17 == 2) {
LAB_001ccaa9:
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)pSVar10,__it);
      __first = pSVar10;
      if (bVar6) goto LAB_001ccadb;
      pSVar10 = (SourceCodeText *)((pSVar10->filename).field_2._M_local_buf + 8);
      goto LAB_001ccaca;
    }
    if (lVar17 == 3) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)pSVar10,__it);
      __first = pSVar10;
      if (bVar6) goto LAB_001ccadb;
      pSVar10 = (SourceCodeText *)((pSVar10->filename).field_2._M_local_buf + 8);
      goto LAB_001ccaa9;
    }
  }
  else {
    lVar15 = (lVar17 >> 7) + 1;
    while (bVar6 = __gnu_cxx::__ops::
                   _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
                   operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                               *)pSVar10,__it), __first = pSVar10,
          pCVar16 = (Comment *)local_140._16_8_, !bVar6) {
      __first = (pSVar10->filename).field_2._M_local_buf + 8;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)__first,__it);
      pCVar16 = (Comment *)local_140._16_8_;
      if (bVar6) break;
      __first = (pSVar10->content).field_2._M_local_buf + 8;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)__first,__it);
      pCVar16 = (Comment *)local_140._16_8_;
      if (bVar6) break;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)&pSVar10[1].filename,__it);
      __first = &pSVar10[1].filename;
      pCVar16 = (Comment *)local_140._16_8_;
      if (bVar6) break;
      pSVar10 = (SourceCodeText *)&pSVar10[1].content;
      lVar15 = lVar15 + -1;
      lVar17 = lVar17 + -0x80;
      if (lVar15 < 2) goto LAB_001cca7a;
    }
LAB_001ccadb:
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((((SourceCodeText *)__first)->filename).field_2._M_local_buf + 8);
    if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar4 &&
        __first != uVar4) {
      do {
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
                operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                            *)this_00,__it);
        if (!bVar6) {
          __it._M_current = this_00;
          std::__cxx11::string::operator=((string *)__first,(string *)this_00);
          __first = (((SourceCodeText *)__first)->filename).field_2._M_local_buf + 8;
        }
        this_00 = this_00 + 1;
      } while (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar4
              );
    }
    if (__first != uVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_128 + 8),(iterator)__first,(iterator)uVar4);
    }
  }
  while ((local_128._8_8_ != aStack_118._M_allocated_capacity &&
         (*(long *)(aStack_118._M_allocated_capacity - 0x18) == 0))) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_128 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (aStack_118._M_allocated_capacity - 0x20));
  }
  while ((UVar5.data = UStack_f8.data, uVar4 = aStack_108._M_allocated_capacity,
         local_128._8_8_ != aStack_118._M_allocated_capacity &&
         (*(size_type *)(local_128._8_8_ + 8) == 0))) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_128 + 8),(iterator)local_128._8_8_);
  }
  pCVar16->valid = (bool)local_128[0];
  pCVar16->isStarSlash = (bool)local_128[1];
  pCVar16->isDoxygenStyle = (bool)local_128[2];
  pCVar16->isReferringBackwards = (bool)local_128[3];
  (pCVar16->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_128._8_8_;
  (pCVar16->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)aStack_118._M_allocated_capacity;
  (pCVar16->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aStack_118._8_8_;
  aStack_118._8_8_ = (pointer)0x0;
  local_128._8_8_ = (SourceCodeText *)0x0;
  aStack_118._M_allocated_capacity = 0;
  aStack_108._M_allocated_capacity = 0;
  (pCVar16->range).start.sourceCode.object = (SourceCodeText *)uVar4;
  (pCVar16->range).start.location.data = (char *)aStack_108._8_8_;
  UStack_f8.data = (char *)0x0;
  (pCVar16->range).end.sourceCode.object = (SourceCodeText *)UVar5.data;
  (pCVar16->range).end.location.data = local_f0.data;
LAB_001ccbb0:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)UStack_f8.data);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull
            ((SourceCodeText *)aStack_108._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_128 + 8));
  return pCVar16;
}

Assistant:

SourceCodeUtilities::Comment SourceCodeUtilities::parseComment (CodeLocation pos)
{
    if (pos.isEmpty())
        return {};

    Comment result;
    pos.location = pos.location.findEndOfWhitespace();
    result.range.start = pos;

    if (pos.location.advanceIfStartsWith ("/*"))
    {
        result.valid = true;
        result.isStarSlash = true;

        while (*pos.location == '*')
        {
            result.isDoxygenStyle = true;
            ++(pos.location);
        }
    }
    else if (pos.location.advanceIfStartsWith ("//"))
    {
        result.valid = true;
        result.isStarSlash = false;

        while (*pos.location == '/')
        {
            result.isDoxygenStyle = true;
            ++(pos.location);
        }
    }
    else
    {
        return {};
    }

    if (pos.location.advanceIfStartsWith ("<"))
        result.isReferringBackwards = true;

    while (*pos.location == ' ')
        ++(pos.location);

    if (result.isStarSlash)
    {
        auto closeComment = pos.location.find ("*/");

        if (closeComment.isEmpty())
            return {};

        result.lines = choc::text::splitIntoLines (std::string (pos.location.getAddress(),
                                                                closeComment.getAddress()),
                                                   false);

        auto firstLineIndent = pos.location.getAddress() - pos.getStartOfLine().location.getAddress();

        for (auto& l : result.lines)
        {
            l = choc::text::trimEnd (l);
            auto leadingSpacesOnLine = l.length() - choc::text::trimStart (l).length();

            if (firstLineIndent > 0 && leadingSpacesOnLine >= (size_t) firstLineIndent)
                l = l.substr ((size_t) firstLineIndent);
        }

        result.range.end = pos;
        result.range.end.location = closeComment;
        result.range.end.location += 2;
    }
    else
    {
        for (;;)
        {
            auto line = choc::text::trim (pos.getSourceLine());

            if (! choc::text::startsWith (line, "//"))
                break;

            line = line.substr (2);

            while (! line.empty() && line[0] == '/')
                line = line.substr (1);

            result.lines.push_back (line);
            pos = pos.getStartOfNextLine();
        }

        result.range.end = pos;

        if (! result.lines.empty())
        {
            auto countLeadingSpaces = [] (std::string_view s) -> size_t
            {
                for (size_t i = 0; i < s.length(); ++i)
                    if (s[i] != ' ')
                        return i;

                return 0;
            };

            size_t leastLeadingSpace = 1000;

            for (auto& l : result.lines)
                leastLeadingSpace = std::min (leastLeadingSpace, countLeadingSpaces (l));

            if (leastLeadingSpace != 0)
                for (auto& l : result.lines)
                    l = l.substr (leastLeadingSpace);
        }
    }

    removeIf (result.lines, [] (const std::string& s) { return choc::text::contains (s, "================")
                                                            || choc::text::contains (s, "****************"); });

    while (! result.lines.empty() && result.lines.back().empty())
        result.lines.erase (result.lines.end() - 1);

    while (! result.lines.empty() && result.lines.front().empty())
        result.lines.erase (result.lines.begin());

    return result;
}